

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall spirv_cross::Compiler::block_is_pure(Compiler *this,SPIRBlock *block)

{
  ushort uVar1;
  size_t sVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  SPIRFunction *func;
  SPIRType *pSVar6;
  SPIRExtension *pSVar7;
  long lVar8;
  Instruction *instr;
  
  if (*(int *)&(block->super_IVariant).field_0xc - 6U < 4) {
    return false;
  }
  sVar2 = (block->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  if (sVar2 == 0) {
    return true;
  }
  instr = (block->ops).super_VectorView<spirv_cross::Instruction>.ptr;
  lVar8 = sVar2 * 0xc;
  do {
    puVar5 = stream(this,instr);
    uVar1 = instr->op;
    if (uVar1 < 99) {
      if (uVar1 - 0x3e < 2) {
        uVar4 = *puVar5;
LAB_003810c3:
        uVar4 = expression_type_id(this,uVar4);
        pSVar6 = Variant::get<spirv_cross::SPIRType>
                           ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar4);
        if (pSVar6->storage != Function) {
          return false;
        }
      }
      else if (uVar1 == 0xc) {
        pSVar7 = Variant::get<spirv_cross::SPIRExtension>
                           ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + puVar5[2]);
        if ((*(int *)&(pSVar7->super_IVariant).field_0xc == 1) && ((puVar5[3] | 0x10) == 0x33)) {
          uVar4 = puVar5[5];
          goto LAB_003810c3;
        }
      }
      else if (uVar1 == 0x39) {
        func = Variant::get<spirv_cross::SPIRFunction>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + puVar5[2]);
        bVar3 = function_is_pure(this,func);
        if (!bVar3) {
          return false;
        }
      }
    }
    else if (uVar1 < 0x115d) {
      if ((uVar1 - 0xda < 0x19) && ((0x1fffecfU >> (uVar1 - 0xda & 0x1f) & 1) != 0)) {
        return false;
      }
      if (uVar1 == 99) {
        return false;
      }
    }
    else {
      if ((uVar1 - 0x115d < 0x21) && ((0x1f0000003U >> ((ulong)(uVar1 - 0x115d) & 0x3f) & 1) != 0))
      {
        return false;
      }
      if ((uVar1 - 0x14d6 < 0x2f) &&
         ((0x40000000040fU >> ((ulong)(uVar1 - 0x14d6) & 0x3f) & 1) != 0)) {
        return false;
      }
      if (uVar1 == 0x14af) {
        return false;
      }
    }
    instr = instr + 1;
    lVar8 = lVar8 + -0xc;
    if (lVar8 == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool Compiler::block_is_pure(const SPIRBlock &block)
{
	// This is a global side effect of the function.
	if (block.terminator == SPIRBlock::Kill ||
	    block.terminator == SPIRBlock::TerminateRay ||
	    block.terminator == SPIRBlock::IgnoreIntersection ||
	    block.terminator == SPIRBlock::EmitMeshTasks)
		return false;

	for (auto &i : block.ops)
	{
		auto ops = stream(i);
		auto op = static_cast<Op>(i.op);

		switch (op)
		{
		case OpFunctionCall:
		{
			uint32_t func = ops[2];
			if (!function_is_pure(get<SPIRFunction>(func)))
				return false;
			break;
		}

		case OpCopyMemory:
		case OpStore:
		{
			auto &type = expression_type(ops[0]);
			if (type.storage != StorageClassFunction)
				return false;
			break;
		}

		case OpImageWrite:
			return false;

		// Atomics are impure.
		case OpAtomicLoad:
		case OpAtomicStore:
		case OpAtomicExchange:
		case OpAtomicCompareExchange:
		case OpAtomicCompareExchangeWeak:
		case OpAtomicIIncrement:
		case OpAtomicIDecrement:
		case OpAtomicIAdd:
		case OpAtomicISub:
		case OpAtomicSMin:
		case OpAtomicUMin:
		case OpAtomicSMax:
		case OpAtomicUMax:
		case OpAtomicAnd:
		case OpAtomicOr:
		case OpAtomicXor:
			return false;

		// Geometry shader builtins modify global state.
		case OpEndPrimitive:
		case OpEmitStreamVertex:
		case OpEndStreamPrimitive:
		case OpEmitVertex:
			return false;

		// Mesh shader functions modify global state.
		// (EmitMeshTasks is a terminator).
		case OpSetMeshOutputsEXT:
			return false;

		// Barriers disallow any reordering, so we should treat blocks with barrier as writing.
		case OpControlBarrier:
		case OpMemoryBarrier:
			return false;

		// Ray tracing builtins are impure.
		case OpReportIntersectionKHR:
		case OpIgnoreIntersectionNV:
		case OpTerminateRayNV:
		case OpTraceNV:
		case OpTraceRayKHR:
		case OpExecuteCallableNV:
		case OpExecuteCallableKHR:
		case OpRayQueryInitializeKHR:
		case OpRayQueryTerminateKHR:
		case OpRayQueryGenerateIntersectionKHR:
		case OpRayQueryConfirmIntersectionKHR:
		case OpRayQueryProceedKHR:
			// There are various getters in ray query, but they are considered pure.
			return false;

			// OpExtInst is potentially impure depending on extension, but GLSL builtins are at least pure.

		case OpDemoteToHelperInvocationEXT:
			// This is a global side effect of the function.
			return false;

		case OpExtInst:
		{
			uint32_t extension_set = ops[2];
			if (get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
			{
				auto op_450 = static_cast<GLSLstd450>(ops[3]);
				switch (op_450)
				{
				case GLSLstd450Modf:
				case GLSLstd450Frexp:
				{
					auto &type = expression_type(ops[5]);
					if (type.storage != StorageClassFunction)
						return false;
					break;
				}

				default:
					break;
				}
			}
			break;
		}

		default:
			break;
		}
	}

	return true;
}